

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1067.cpp
# Opt level: O2

int main(void)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
  *this;
  iterator iVar1;
  tree *ptVar2;
  mapped_type *pptVar3;
  int iVar4;
  ulong uVar5;
  allocator local_a9;
  tree *local_a8;
  int n;
  string patch;
  string local_70;
  string dir;
  
  std::istream::operator>>((istream *)&std::cin,&n);
  local_a8 = (tree *)operator_new(0x50);
  tree::tree(local_a8);
  for (iVar4 = 0; iVar4 < n; iVar4 = iVar4 + 1) {
    patch._M_dataplus._M_p = (pointer)&patch.field_2;
    patch._M_string_length = 0;
    patch.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&std::cin,(string *)&patch);
    std::__cxx11::string::string((string *)&dir,"",&local_a9);
    ptVar2 = local_a8;
    for (uVar5 = 0; uVar5 <= patch._M_string_length; uVar5 = uVar5 + 1) {
      if ((patch._M_dataplus._M_p[uVar5] == '\\') || (patch._M_dataplus._M_p[uVar5] == '\0')) {
        this = &ptVar2->child;
        iVar1 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
                ::find(&this->_M_t,&dir);
        if ((_Rb_tree_header *)iVar1._M_node == &(ptVar2->child)._M_t._M_impl.super__Rb_tree_header)
        {
          ptVar2 = (tree *)operator_new(0x50);
          std::__cxx11::string::string((string *)&local_70,(string *)&dir);
          tree::tree(ptVar2,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          pptVar3 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
                    ::operator[](this,&dir);
          *pptVar3 = ptVar2;
          iVar1 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
                  ::find(&this->_M_t,&dir);
        }
        ptVar2 = *(tree **)(iVar1._M_node + 2);
        std::__cxx11::string::assign((char *)&dir);
      }
      else {
        std::__cxx11::string::push_back((char)&dir);
      }
    }
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::string::~string((string *)&patch);
  }
  print_tr(local_a8,0);
  return 0;
}

Assistant:

int main() {
    int n;
    std::cin >> n;

    tree *tr_root = new tree();

    for (int i = 0; i < n; ++i) {
        std::string patch;
        std::cin >> patch;
        std::string dir = "";

        tree *tr = tr_root;
        for (int j = 0; j <= patch.size(); ++j) {
            if (patch[j] == '\\' || patch[j] == '\0') {
                auto dir_tr = tr->child.find(dir);
                if (dir_tr == tr->child.end()){
                    tree *new_tree = new tree(dir);
                    tr->child[dir] = new_tree;
                    tr = tr->child.find(dir)->second;
                } else {
                    tr = dir_tr->second;
                }
                dir = "";
            } else {
                dir += patch[j];
            }
        }

    }
    print_tr(tr_root, 0);
    return 0;
}